

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall Graph::setBoundaries(Graph *this)

{
  pointer pvVar1;
  long *plVar2;
  long lVar3;
  int node;
  size_type __n;
  reference rVar4;
  
  lVar3 = 8;
  for (__n = 0; (long)__n < (long)this->vertexCount; __n = __n + 1) {
    pvVar1 = (this->adjList).
             super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar2 = *(long **)((long)pvVar1 + lVar3 + -8);
    if ((*(long *)((long)&(pvVar1->super__Vector_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl +
                  lVar3) - (long)plVar2 != 0x10) ||
       (*(int *)(*plVar2 + 0x10) != *(int *)(plVar2[1] + 0x10))) {
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->isBoundaryList,__n);
      *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
    }
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

void Graph::setBoundaries() {
  for(int node = 0; node < vertexCount; node++) {
    if(adjList[node].size() != 2 || adjList[node][0]->ttd != adjList[node][1]->ttd ) {
      isBoundaryList[node] = true;
    }
    
  }
  
}